

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImStrdupcpy(char *dst,size_t *p_dst_size,char *src)

{
  size_t sVar1;
  char *pcVar2;
  ulong size;
  size_t sVar3;
  
  if (p_dst_size == (size_t *)0x0) {
    sVar1 = strlen(dst);
    sVar3 = sVar1 + 1;
  }
  else {
    sVar3 = *p_dst_size;
  }
  sVar1 = strlen(src);
  size = sVar1 + 1;
  if (sVar3 < size) {
    ImGui::MemFree(dst);
    dst = (char *)ImGui::MemAlloc(size);
    if (p_dst_size != (size_t *)0x0) {
      *p_dst_size = size;
    }
  }
  pcVar2 = (char *)memcpy(dst,src,size);
  return pcVar2;
}

Assistant:

char* ImStrdupcpy(char* dst, size_t* p_dst_size, const char* src)
{
    size_t dst_buf_size = p_dst_size ? *p_dst_size : strlen(dst) + 1;
    size_t src_size = strlen(src) + 1;
    if (dst_buf_size < src_size)
    {
        IM_FREE(dst);
        dst = (char*)IM_ALLOC(src_size);
        if (p_dst_size)
            *p_dst_size = src_size;
    }
    return (char*)memcpy(dst, (const void*)src, src_size);
}